

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseBuilder::registerLabelNode(BaseBuilder *this,LabelNode *node)

{
  int iVar1;
  LabelNode **ppLVar2;
  LabelNode *in_RSI;
  ZoneVector<asmjit::v1_14::LabelNode_*> *in_RDI;
  Error _err_1;
  uint32_t labelId;
  Error _err;
  LabelEntry *le;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  ZoneAllocator *in_stack_ffffffffffffffa8;
  ZoneVector<asmjit::v1_14::LabelNode_*> *in_stack_ffffffffffffffb0;
  LabelNode *pLVar3;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_30;
  Error local_14;
  
  if (*(LabelEntry **)(in_RDI + 0x30) == (LabelEntry *)0x0) {
    local_14 = DebugUtils::errored(5);
  }
  else {
    local_14 = CodeHolder::newLabelEntry
                         ((CodeHolder *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (LabelEntry **)in_RDI);
    if (local_14 == 0) {
      iVar1 = *(int *)(local_30 + 0xc);
      if (iVar1 + 1U <= *(uint *)(in_RDI + 400)) {
        DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
      }
      local_14 = ZoneVector<asmjit::v1_14::LabelNode_*>::resize
                           (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
      if (local_14 == 0) {
        pLVar3 = in_RSI;
        ppLVar2 = ZoneVector<asmjit::v1_14::LabelNode_*>::operator[](in_RDI,(size_t)in_RSI);
        *ppLVar2 = pLVar3;
        *(int *)(in_RSI + 0x30) = iVar1;
        local_14 = 0;
      }
    }
  }
  return local_14;
}

Assistant:

Error BaseBuilder::registerLabelNode(LabelNode* node) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  LabelEntry* le;
  ASMJIT_PROPAGATE(_code->newLabelEntry(&le));
  uint32_t labelId = le->id();

  // We just added one label so it must be true.
  ASMJIT_ASSERT(_labelNodes.size() < labelId + 1);
  ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, labelId + 1));

  _labelNodes[labelId] = node;
  node->_labelId = labelId;

  return kErrorOk;
}